

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_validate(App *this)

{
  pointer psVar1;
  ulong uVar2;
  difference_type dVar3;
  difference_type dVar4;
  InvalidError *pIVar5;
  long lVar6;
  App_p *app;
  pointer psVar7;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  dVar3 = ::std::
          __count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (1 < dVar3) {
    dVar4 = ::std::
            __count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>>
                      ((this->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (1 < dVar3 - dVar4) {
      pIVar5 = (InvalidError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_48,(string *)&this->name_);
      InvalidError::InvalidError(pIVar5,&local_48);
      __cxa_throw(pIVar5,&InvalidError::typeinfo,Error::~Error);
    }
  }
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  for (psVar7 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1) {
    _validate((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    lVar6 = lVar6 + (ulong)((((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->name_)._M_string_length == 0);
  }
  uVar2 = this->require_option_min_;
  if (uVar2 != 0) {
    if (this->require_option_max_ < uVar2 && this->require_option_max_ != 0) {
      pIVar5 = (InvalidError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Required min options greater than required max options",
                 &local_89);
      InvalidError::InvalidError(pIVar5,&local_68,InvalidError);
      __cxa_throw(pIVar5,&InvalidError::typeinfo,Error::~Error);
    }
    if ((ulong)(((long)(this->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + lVar6) < uVar2) {
      pIVar5 = (InvalidError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Required min options greater than number of available options"
                 ,&local_89);
      InvalidError::InvalidError(pIVar5,&local_88,InvalidError);
      __cxa_throw(pIVar5,&InvalidError::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

void _validate() const {
        // count the number of positional only args
        auto pcount = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional();
        });
        if(pcount > 1) {
            auto pcount_req = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
                return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional() &&
                       opt->get_required();
            });
            if(pcount - pcount_req > 1) {
                throw InvalidError(name_);
            }
        }

        std::size_t nameless_subs{0};
        for(const App_p &app : subcommands_) {
            app->_validate();
            if(app->get_name().empty())
                ++nameless_subs;
        }

        if(require_option_min_ > 0) {
            if(require_option_max_ > 0) {
                if(require_option_max_ < require_option_min_) {
                    throw(InvalidError("Required min options greater than required max options",
                                       ExitCodes::InvalidError));
                }
            }
            if(require_option_min_ > (options_.size() + nameless_subs)) {
                throw(InvalidError("Required min options greater than number of available options",
                                   ExitCodes::InvalidError));
            }
        }
    }